

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void setSectorSize(Pager *pPager)

{
  uint uVar1;
  u32 uVar2;
  sqlite3_file *pFile;
  
  uVar2 = 0x200;
  if (pPager->tempFile == '\0') {
    pFile = pPager->fd;
    if (pFile->pMethods != (sqlite3_io_methods *)0x0) {
      uVar1 = (*pFile->pMethods->xDeviceCharacteristics)(pFile);
      if ((uVar1 >> 0xc & 1) != 0) goto LAB_001275a3;
      pFile = pPager->fd;
    }
    uVar2 = sqlite3SectorSize(pFile);
  }
LAB_001275a3:
  pPager->sectorSize = uVar2;
  return;
}

Assistant:

static void setSectorSize(Pager *pPager){
  assert( isOpen(pPager->fd) || pPager->tempFile );

  if( pPager->tempFile
   || (sqlite3OsDeviceCharacteristics(pPager->fd) &
              SQLITE_IOCAP_POWERSAFE_OVERWRITE)!=0
  ){
    /* Sector size doesn't matter for temporary files. Also, the file
    ** may not have been opened yet, in which case the OsSectorSize()
    ** call will segfault. */
    pPager->sectorSize = 512;
  }else{
    pPager->sectorSize = sqlite3SectorSize(pPager->fd);
  }
}